

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_conversions.cpp
# Opt level: O0

void convert_ARGB32_to_RGBA64<false>(QImageData *dest,QImageData *src,ImageConversionFlags param_3)

{
  FetchAndConvertPixelsFunc64 p_Var1;
  Format FVar2;
  long in_RSI;
  long in_RDI;
  int i;
  FetchAndConvertPixelsFunc64 fetch;
  uchar *dest_data;
  uchar *src_data;
  int local_34;
  QRgba64 *local_28;
  uchar *local_20;
  
  local_20 = *(uchar **)(in_RSI + 0x38);
  local_28 = *(QRgba64 **)(in_RDI + 0x38);
  FVar2 = qt_toPremultipliedFormat(Format_Invalid);
  p_Var1 = qPixelLayouts[FVar2].fetchToRGBA64PM;
  for (local_34 = 0; local_34 < *(int *)(in_RSI + 8); local_34 = local_34 + 1) {
    (*p_Var1)(local_28,local_20,0,*(int *)(in_RSI + 4),(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0
             );
    local_20 = local_20 + *(long *)(in_RSI + 0x48);
    local_28 = (QRgba64 *)((long)&local_28->rgba + *(long *)(in_RDI + 0x48));
  }
  return;
}

Assistant:

static void convert_ARGB32_to_RGBA64(QImageData *dest, const QImageData *src, Qt::ImageConversionFlags)
{
    Q_ASSERT(RGBA || src->format == QImage::Format_ARGB32);
    Q_ASSERT(!RGBA || src->format == QImage::Format_RGBA8888);
    Q_ASSERT(dest->format == QImage::Format_RGBA64);
    Q_ASSERT(src->width == dest->width);
    Q_ASSERT(src->height == dest->height);

    const uchar *src_data = src->data;
    uchar *dest_data = dest->data;
    const FetchAndConvertPixelsFunc64 fetch = qPixelLayouts[qt_toPremultipliedFormat(src->format)].fetchToRGBA64PM;

    for (int i = 0; i < src->height; ++i) {
        fetch(reinterpret_cast<QRgba64 *>(dest_data), src_data, 0, src->width, nullptr, nullptr);
        src_data += src->bytes_per_line;
        dest_data += dest->bytes_per_line;
    }
}